

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqlite_create_function
              (unqlite_vm *pVm,char *zName,
              _func_int_unqlite_context_ptr_int_unqlite_value_ptr_ptr *xFunc,void *pUserData)

{
  char *pcVar1;
  char cVar2;
  sxu32 sVar3;
  sxi32 sVar4;
  ushort **ppuVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  SyString local_40;
  
  sVar4 = -0x18;
  if ((pVm != (unqlite_vm *)0x0) && (pVm->nMagic != 0xdead2bad)) {
    sVar3 = SyStrlen(zName);
    uVar7 = (ulong)sVar3;
    pcVar1 = zName + uVar7;
    while (((pcVar6 = pcVar1, (uint)uVar7 != 0 &&
            (cVar2 = *zName, pcVar6 = zName, (ulong)(long)cVar2 < 0xffffffffffffffc0)) &&
           (ppuVar5 = __ctype_b_loc(), (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0
           ))) {
      zName = zName + 1;
      uVar7 = uVar7 - 1;
    }
    sVar4 = -9;
    local_40.zString = pcVar6;
    local_40.nByte = (uint)uVar7;
    do {
      uVar8 = uVar7;
      if (uVar8 == 0) {
        return -9;
      }
      cVar2 = pcVar6[uVar8 - 1];
    } while (((ulong)(long)cVar2 < 0xffffffffffffffc0) &&
            (ppuVar5 = __ctype_b_loc(), uVar7 = uVar8 - 1,
            (*(byte *)((long)*ppuVar5 + (long)cVar2 * 2 + 1) & 0x20) != 0));
    local_40.nByte = (uint)uVar8;
    if (xFunc != (_func_int_unqlite_context_ptr_int_unqlite_value_ptr_ptr *)0x0) {
      sVar4 = jx9VmInstallForeignFunction(pVm->pJx9Vm,&local_40,(ProcHostFunction)xFunc,pUserData);
    }
  }
  return sVar4;
}

Assistant:

int unqlite_create_function(unqlite_vm *pVm, const char *zName,int (*xFunc)(unqlite_context *,int,unqlite_value **),void *pUserData)
{
	SyString sName;
	int rc;
	if( UNQLITE_VM_MISUSE(pVm) ){
		return UNQLITE_CORRUPT;
	}
	SyStringInitFromBuf(&sName, zName, SyStrlen(zName));
	/* Remove leading and trailing white spaces */
	SyStringFullTrim(&sName);
	/* Ticket 1433-003: NULL values are not allowed */
	if( sName.nByte < 1 || xFunc == 0 ){
		return UNQLITE_INVALID;
	}
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Acquire VM mutex */
	 SyMutexEnter(sUnqlMPGlobal.pMutexMethods, pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
	 if( sUnqlMPGlobal.nThreadingLevel > UNQLITE_THREAD_LEVEL_SINGLE && 
		 UNQLITE_THRD_VM_RELEASE(pVm) ){
			 return UNQLITE_ABORT; /* Another thread have released this instance */
	 }
#endif
	 /* Install the foreign function */
	 rc = jx9VmInstallForeignFunction(pVm->pJx9Vm,&sName,xFunc,pUserData);
#if defined(UNQLITE_ENABLE_THREADS)
	 /* Leave DB mutex */
	 SyMutexLeave(sUnqlMPGlobal.pMutexMethods,pVm->pMutex); /* NO-OP if sUnqlMPGlobal.nThreadingLevel != UNQLITE_THREAD_LEVEL_MULTI */
#endif
	return rc;
}